

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

uint to_hex(char ch)

{
  uint local_c;
  char ch_local;
  
  if ((ch < '0') || ('9' < ch)) {
    if ((ch < 'a') || ('f' < ch)) {
      if ((ch < 'A') || ('F' < ch)) {
        errx(1,"character \"%c\" is not hex\n",(int)ch);
      }
      else {
        local_c = (int)ch - 0x37;
      }
    }
    else {
      local_c = (int)ch - 0x57;
    }
  }
  else {
    local_c = (int)ch - 0x30;
  }
  return local_c;
}

Assistant:

static unsigned to_hex(char ch) {
    if (ch >= '0' && ch <= '9')
        return ch - '0';
    if (ch >= 'a' && ch <= 'f')
        return ch - 'a' + 10;
    if (ch >= 'A' && ch <= 'F')
        return ch - 'A' + 10;

    errx(1, "character \"%c\" is not hex\n", ch);
}